

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * __thiscall
JSON::JSONArray::toString_abi_cxx11_(string *__return_storage_ptr__,JSONArray *this,int indent)

{
  int local_1ac;
  stringstream local_1a8 [4];
  int i;
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  JSONArray *pJStack_18;
  int indent_local;
  JSONArray *this_local;
  
  local_1c = indent;
  pJStack_18 = this;
  this_local = (JSONArray *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  for (local_1ac = 0; local_1ac < local_1c; local_1ac = local_1ac + 1) {
    std::operator<<(local_198," ");
  }
  operator<<(local_198,this);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string JSONArray::toString(int indent) const {
	stringstream ss;
	for(int i=0;i<indent;i++)
		ss << " ";
	ss << (*this);
	return ss.str();
}